

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldStateTest::MakeRepeatedDirty
          (MapFieldStateTest *this,MapFieldType *map_field)

{
  MapFieldBase *map_field_base;
  MapFieldType *map_field_local;
  MapFieldStateTest *this_local;
  
  MakeMapDirty(this,map_field);
  MapFieldBase::MutableRepeatedField((MapFieldBase *)map_field);
  Map<int,_int>::clear(&(map_field->super_TypeDefinedMapFieldBase<int,_int>).field_0.map_);
  Expect(this,map_field,REPEATED_DIRTY,0,1);
  return;
}

Assistant:

void MakeRepeatedDirty(MapFieldType* map_field) {
    MakeMapDirty(map_field);
    MapFieldBase* map_field_base = map_field;
    map_field_base->MutableRepeatedField();
    // We use map_ because we don't want to disturb the syncing
    map_field->map_.clear();

    Expect(map_field, REPEATED_DIRTY, 0, 1);
  }